

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forest_device.cpp
# Opt level: O0

void device_init(char *cfg)

{
  undefined8 uVar1;
  uint i;
  uint in_stack_0000004c;
  RTCScene in_stack_00000050;
  uint local_c;
  
  rtcSetDeviceMemoryMonitorFunction(g_device,embree::monitorMemoryFunction,0);
  embree::TutorialData_Constructor((TutorialData *)&embree::data);
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    uVar1 = rtcNewScene(g_device);
    *(undefined8 *)(embree::scene_trees + (ulong)local_c * 8) = uVar1;
    embree::addTree(in_stack_00000050,in_stack_0000004c);
    rtcCommitScene(*(undefined8 *)(embree::scene_trees + (ulong)local_c * 8));
  }
  embree::scene_terrain = rtcNewScene(g_device);
  embree::addTerrain((RTCScene)cfg);
  rtcCommitScene(embree::scene_terrain);
  return;
}

Assistant:

void device_init (char* cfg)
{
  rtcSetDeviceMemoryMonitorFunction(g_device, monitorMemoryFunction, nullptr);

  TutorialData_Constructor(&data);

  for (unsigned int i = 0; i < 6; ++i) {
    scene_trees[i] = rtcNewScene(g_device);
    addTree(scene_trees[i], i);
    rtcCommitScene(scene_trees[i]);
  }

  /* add ground plane */
  scene_terrain = rtcNewScene(g_device);
  addTerrain(scene_terrain);
  rtcCommitScene(scene_terrain);
}